

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-defend.c
# Opt level: O0

wchar_t borg_defend_aux_shield(wchar_t p1)

{
  _Bool _Var1;
  wchar_t local_1c;
  wchar_t local_14;
  wchar_t p2;
  wchar_t p1_local;
  
  if (((((!borg.temp.shield) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
      (borg.trait[0x79] == 0)) &&
     ((0 < borg.has[kv_mush_stoneskin] || (_Var1 = borg_equips_item(act_shroom_stone,true), _Var1)))
     ) {
    borg.temp.shield = true;
    local_14 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
    borg.temp.shield = false;
    if (borg_fighting_unique != L'\0') {
      local_14 = (local_14 * 7) / 10;
    }
    if (local_14 < p1) {
      if (borg_fighting_unique == L'\0') {
        local_1c = (int)avoidance / 2;
      }
      else {
        local_1c = ((int)avoidance << 1) / 3;
      }
      if ((local_14 <= local_1c) && ((int)avoidance / 7 < p1)) {
        if ((borg_simulate & 1U) != 0) {
          borg.temp.shield = false;
          return p1 - local_14;
        }
        borg_note("# Attempting to eat a stone skin");
        _Var1 = borg_eat(0x1d,sv_mush_stoneskin);
        if ((_Var1) || (_Var1 = borg_activate_item(act_shroom_stone), _Var1)) {
          borg.no_rest_prep = 2000;
          return p1 - local_14;
        }
      }
    }
  }
  return L'\0';
}

Assistant:

static int borg_defend_aux_shield(int p1)
{
    int p2 = 0;

    /* if already protected */
    if (borg.temp.shield)
        return 0;

    /* Cant when screwed */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED]
        || borg.trait[BI_ISFORGET])
        return 0;

    if (borg.has[kv_mush_stoneskin] <= 0
        && !borg_equips_item(act_shroom_stone, true))
        return 0;

    /* pretend we are protected and look again */
    borg.temp.shield = true;
    p2               = borg_danger(borg.c.y, borg.c.x, 1, true, false);
    borg.temp.shield = false;

    /* slightly enhance the value if fighting a unique */
    if (borg_fighting_unique)
        p2 = (p2 * 7 / 10);

    /* if this is an improvement and we may not avoid monster now and */
    /* we may have before */
    if (p1 > p2
        && p2 <= (borg_fighting_unique ? ((avoidance * 2) / 3)
                                       : (avoidance / 2))
        && p1 > (avoidance / 7)) {
        /* Simulation */
        if (borg_simulate)
            return (p1 - p2);

        borg_note("# Attempting to eat a stone skin");

        /* do it! */
        if (borg_eat(TV_MUSHROOM, sv_mush_stoneskin)
            || borg_activate_item(act_shroom_stone)) {
            /* No resting to recoup mana */
            borg.no_rest_prep = 2000;
            return (p1 - p2);
        }
    }

    /* default to can't do it. */
    return 0;
}